

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EasyScreenCapturer.cpp
# Opt level: O2

shared_ptr<media::EasyScreenCapturer> media::EasyScreenCapturer::GetInstance(void)

{
  EasyScreenCapturerLinux *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<media::EasyScreenCapturer> sVar1;
  
  if (m_pInstance == 0) {
    this = (EasyScreenCapturerLinux *)operator_new(8);
    EasyScreenCapturerLinux::EasyScreenCapturerLinux(this);
    std::__shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>::
    reset<media::EasyScreenCapturerLinux>
              ((__shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2> *)&m_pInstance,
               this);
  }
  std::__shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (in_RDI,(__shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2> *)
                    &m_pInstance);
  sVar1.super___shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<media::EasyScreenCapturer>)
         sVar1.super___shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<EasyScreenCapturer> EasyScreenCapturer::GetInstance()
{
  if (!m_pInstance)
  {
#ifdef OS_WIN
    m_pInstance.reset(new EasyScreenCapturerWin());
#elif defined(OS_UNIX)
    m_pInstance.reset(new EasyScreenCapturerLinux());
#else
    m_pInstance.reset(new EasyScreenCapturerFaker());
#endif
  }

  return m_pInstance;
}